

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

int create_swapchain(Init *init)

{
  VkResult VVar1;
  SwapchainBuilder *this;
  Swapchain *pSVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  Swapchain *swapchain;
  byte bVar6;
  error_code eVar7;
  string asStack_148 [32];
  Result<vkb::Swapchain> swap_ret;
  SwapchainBuilder swapchain_builder;
  
  bVar6 = 0;
  vkb::SwapchainBuilder::SwapchainBuilder(&swapchain_builder,&init->device);
  swapchain = &init->swapchain;
  this = vkb::SwapchainBuilder::set_old_swapchain(&swapchain_builder,swapchain);
  vkb::SwapchainBuilder::build(&swap_ret,this);
  if (swap_ret.m_init == false) {
    eVar7 = vkb::Result<vkb::Swapchain>::error(&swap_ret);
    (**(code **)(*(long *)eVar7._M_cat + 0x20))(asStack_148,eVar7._M_cat,eVar7._M_value);
    poVar3 = std::operator<<((ostream *)&std::cout,asStack_148);
    poVar3 = std::operator<<(poVar3," ");
    VVar1 = vkb::Result<vkb::Swapchain>::vk_result(&swap_ret);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,VVar1);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(asStack_148);
    iVar5 = -1;
  }
  else {
    vkb::destroy_swapchain(swapchain);
    pSVar2 = vkb::Result<vkb::Swapchain>::value(&swap_ret);
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      swapchain->device = pSVar2->device;
      pSVar2 = (Swapchain *)((long)pSVar2 + (ulong)bVar6 * -0x10 + 8);
      swapchain = (Swapchain *)((long)swapchain + (ulong)bVar6 * -0x10 + 8);
    }
    iVar5 = 0;
  }
  vkb::SwapchainBuilder::SwapchainInfo::~SwapchainInfo(&swapchain_builder.info);
  return iVar5;
}

Assistant:

int create_swapchain(Init& init) {

    vkb::SwapchainBuilder swapchain_builder{ init.device };
    auto swap_ret = swapchain_builder.set_old_swapchain(init.swapchain).build();
    if (!swap_ret) {
        std::cout << swap_ret.error().message() << " " << swap_ret.vk_result() << "\n";
        return -1;
    }
    vkb::destroy_swapchain(init.swapchain);
    init.swapchain = swap_ret.value();
    return 0;
}